

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O0

char * Smt_VecEntryName(Smt_Prs_t *p,Vec_Int_t *vFans,int i)

{
  int iVar1;
  undefined8 local_28;
  int i_local;
  Vec_Int_t *vFans_local;
  Smt_Prs_t *p_local;
  
  iVar1 = Vec_IntEntry(vFans,i);
  iVar1 = Smt_EntryIsName(iVar1);
  if (iVar1 == 0) {
    local_28 = (char *)0x0;
  }
  else {
    iVar1 = Vec_IntEntry(vFans,i);
    local_28 = Smt_EntryName(p,iVar1);
  }
  return local_28;
}

Assistant:

static inline char *      Smt_VecEntryName( Smt_Prs_t * p, Vec_Int_t * vFans, int i )         { return Smt_EntryIsName(Vec_IntEntry(vFans, i)) ? Smt_EntryName(p, Vec_IntEntry(vFans, i)) : NULL;                          }